

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O1

tuple * tuple_generate_from_ISI(tuple *__return_storage_ptr__,uint32_t X,parameters *P)

{
  uint32_t uVar1;
  int d;
  long lVar2;
  int iVar3;
  int iVar4;
  uint32_t y;
  
  y = P->J * 0x281b + 0x281b + (P->J * 0x3e5 + 0xd157U | 1) * X;
  uVar1 = Rand(y,0,0x100000);
  iVar3 = P->W;
  lVar2 = 1;
  while (((int)uVar1 < *(int *)(&UNK_00106b2c + lVar2 * 4) || (f[lVar2] <= (int)uVar1))) {
    lVar2 = lVar2 + 1;
    if (lVar2 == 0x1f) {
      iVar4 = -1;
LAB_00101f3b:
      __return_storage_ptr__->d = iVar4;
      uVar1 = Rand(y,1,iVar3 + -1);
      __return_storage_ptr__->a = uVar1 + 1;
      iVar3 = 2;
      uVar1 = Rand(y,2,P->W);
      __return_storage_ptr__->b = uVar1;
      if (iVar4 < 4) {
        uVar1 = Rand(X,3,2);
        iVar3 = uVar1 + 2;
      }
      __return_storage_ptr__->d1 = iVar3;
      uVar1 = Rand(X,4,P->P1 + -1);
      __return_storage_ptr__->a1 = uVar1 + 1;
      uVar1 = Rand(X,5,P->P1);
      __return_storage_ptr__->b1 = uVar1;
      return __return_storage_ptr__;
    }
  }
  iVar4 = iVar3 + -2;
  if ((int)lVar2 < iVar4) {
    iVar4 = (int)lVar2;
  }
  goto LAB_00101f3b;
}

Assistant:

tuple tuple_generate_from_ISI(uint32_t X, const parameters* P)
{
	const uint32_t A = (53591 + P->J * 997) | 0x1;
	const uint32_t B = 10267 * (P->J + 1);
	const uint32_t y = (B + X*A);
	const uint32_t v = Rand(y, 0, 1 << 20);

	tuple T;
	T.d = Deg(v, P->W);
	T.a = 1 + Rand(y, 1, P->W - 1);
	T.b = Rand(y, 2, P->W);
	if (T.d < 4) {
		T.d1 = 2 + Rand(X, 3, 2);
	} else {
		T.d1 = 2;
	}
	T.a1 = 1 + Rand(X, 4, P->P1 - 1);
	T.b1 = Rand(X, 5, P->P1);

	return T;
}